

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> __thiscall
anon_unknown.dwarf_83ee8::BuildManifestActions::readFile
          (BuildManifestActions *this,StringRef path,StringRef forFilename,Token *forToken)

{
  StringRef filename;
  bool bVar1;
  reference ptVar2;
  undefined8 uVar3;
  Parser *parser;
  Error *E;
  char *pcVar4;
  StringRef filename_00;
  Token *in_stack_00000008;
  StringRef local_b8;
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  string error;
  undefined1 local_58 [8];
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  BuildManifestActions *this_local;
  StringRef forFilename_local;
  StringRef path_local;
  
  pcVar4 = path.Data;
  filename_00.Length = path.Length;
  filename_00.Data = local_58;
  bufferOrError._8_8_ = pcVar4;
  llbuild::commands::util::readFileContents(filename_00);
  bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_58);
  if (bVar1) {
    ptVar2 = llvm::
             Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::operator*((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                          *)local_58);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::unique_ptr
              ((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)this,
               ptVar2);
    error.field_2._12_4_ = 1;
  }
  else {
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    takeError((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
               *)local_98);
    llvm::toString_abi_cxx11_((string *)local_90,(llvm *)local_98,E);
    llvm::Error::~Error((Error *)local_98);
    *(int *)(pcVar4 + 0x18) = *(int *)(pcVar4 + 0x18) + 1;
    if (in_stack_00000008 == (Token *)0x0) {
      BuildContext::emitError(*(BuildContext **)(pcVar4 + 8),(string *)local_90);
    }
    else {
      uVar3 = std::__cxx11::string::data();
      local_b8.Data = (char *)uVar3;
      uVar3 = std::__cxx11::string::length();
      local_b8.Length = uVar3;
      parser = llbuild::ninja::ManifestLoader::getCurrentParser(*(ManifestLoader **)(pcVar4 + 0x10))
      ;
      filename.Length = (size_t)forToken;
      filename.Data = (char *)forFilename.Length;
      llbuild::commands::util::emitError(filename,local_b8,in_stack_00000008,parser);
    }
    std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::MemoryBuffer>,void>
              ((unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>> *)this,
               (nullptr_t)0x0);
    error.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_90);
  }
  llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
  ~Expected((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             *)local_58);
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         this;
}

Assistant:

virtual std::unique_ptr<llvm::MemoryBuffer> readFile(
      StringRef path, StringRef forFilename,
      const ninja::Token* forToken) override {
    auto bufferOrError = util::readFileContents(path);
    if (bufferOrError)
      return std::move(*bufferOrError);

    // TODO: util::emitError doesn't use the console queue?
    std::string error = llvm::toString(bufferOrError.takeError());
    ++numErrors;
    if (forToken) {
      util::emitError(forFilename, error, *forToken,
                      loader->getCurrentParser());
    } else {
      context.emitError(std::move(error));
    }
    return nullptr;
  }